

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

shared_ptr<bytecode::CompiledFile> __thiscall
compiler::CompilerAstWalker::ConstructCompiledFile(CompilerAstWalker *this)

{
  element_type *peVar1;
  size_type localsCount;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar2;
  vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_90;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> local_78;
  Function local_58;
  CompilerAstWalker *this_local;
  
  this_local = this;
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x128));
  localsCount = std::
                vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                ::size(&peVar1->variables);
  local_78.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            (&local_78);
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x128));
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            (&local_90,&peVar1->byteCode);
  bytecode::Function::Function(&local_58,0,localsCount,&local_78,&local_90);
  std::
  make_shared<bytecode::CompiledFile,bytecode::Function,std::vector<bytecode::Function,std::allocator<bytecode::Function>>&,std::vector<bytecode::ObjectConstructor,std::allocator<bytecode::ObjectConstructor>>&,std::vector<long,std::allocator<long>>&,std::vector<double,std::allocator<double>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((Function *)this,
             (vector<bytecode::Function,_std::allocator<bytecode::Function>_> *)&local_58,
             (vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *)
             (in_RSI + 8),(vector<long,_std::allocator<long>_> *)(in_RSI + 0x20),
             (vector<double,_std::allocator<double>_> *)(in_RSI + 0x38),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0x88));
  bytecode::Function::~Function(&local_58);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::~vector(&local_90);
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::~vector
            (&local_78);
  sVar2.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar2.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> ConstructCompiledFile() noexcept {
    return std::make_shared<bytecode::CompiledFile>(
      bytecode::Function{ 0, this->ec->variables.size(), {}, this->ec->byteCode },
      this->functions,
      this->objects,
      this->intConstants,
      this->floatConstants,
      this->stringConstants
    );
  }